

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O2

void __thiscall
tchecker::ta::system_t::set_guards
          (system_t *this,edge_id_t id,
          range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
          *guards)

{
  intvars_t *intvars;
  bool bVar1;
  bytecode_t *pbVar2;
  invalid_argument *this_00;
  shared_ptr<tchecker::typed_expression_t> guard_typed_expr;
  shared_ptr<tchecker::expression_t> guard_expr;
  shared_ptr<long> guard_bytecode;
  _Any_data local_308;
  code *local_2f8;
  code *local_2f0;
  integer_variables_t localvars;
  array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  stringstream oss;
  __shared_ptr<long,_(__gnu_cxx::_Lock_policy)2> local_198 [23];
  
  memset(&localvars,0,0xa0);
  array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::array_variables_t(&local_248,
                      (array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this);
  intvars = &(this->super_system_t).super_system_t.super_intvars_t;
  conjunction_from_attributes
            ((ta *)&guard_expr,guards,&localvars,&intvars->_integer_variables,
             (clock_variables_t *)&local_248);
  array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~array_variables_t(&local_248);
  if (guard_expr.super___shared_ptr<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Syntax error");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_308._M_unused._M_object = (void *)0x0;
  local_308._8_8_ = 0;
  local_2f0 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_tchecker::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/expression/typechecking.hh:40:54)>
              ::_M_invoke;
  local_2f8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_tchecker::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/expression/typechecking.hh:40:54)>
              ::_M_manager;
  typecheck((tchecker *)&guard_typed_expr,
            guard_expr.super___shared_ptr<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            ,&localvars,&intvars->_integer_variables,(clock_variables_t *)this,
            (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             *)&local_308);
  std::_Function_base::~_Function_base((_Function_base *)&local_308);
  bVar1 = bool_valued((guard_typed_expr.
                       super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->_type);
  if (bVar1) {
    pbVar2 = compile(guard_typed_expr.
                     super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
    std::__shared_ptr<long,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<long,std::default_delete<long[]>,void>
              ((__shared_ptr<long,(__gnu_cxx::_Lock_policy)2> *)&guard_bytecode,pbVar2);
    std::__shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2> *)&oss,
               &guard_typed_expr.
                super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (local_198,&guard_bytecode.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>);
    compiled_expression_t::operator=
              ((this->_guards).
               super__Vector_base<tchecker::ta::system_t::compiled_expression_t,_std::allocator<tchecker::ta::system_t::compiled_expression_t>_>
               ._M_impl.super__Vector_impl_data._M_start + id,(compiled_expression_t *)&oss);
    compiled_expression_t::~compiled_expression_t((compiled_expression_t *)&oss);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&guard_bytecode.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&guard_typed_expr.
                super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&guard_expr.super___shared_ptr<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~array_variables_t
              (&localvars.
                super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
    return;
  }
  __assert_fail("tchecker::bool_valued(guard_typed_expr->type())",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/ta/system.cc"
                ,0xe6,
                "void tchecker::ta::system_t::set_guards(tchecker::edge_id_t, const tchecker::range_t<tchecker::system::attributes_t::const_iterator_t> &)"
               );
}

Assistant:

void system_t::set_guards(tchecker::edge_id_t id,
                          tchecker::range_t<tchecker::system::attributes_t::const_iterator_t> const & guards)
{
  tchecker::integer_variables_t localvars;

  std::shared_ptr<tchecker::expression_t> guard_expr{
      conjunction_from_attributes(guards, localvars, integer_variables(), clock_variables())};
  if (guard_expr.get() == nullptr)
    throw std::invalid_argument("Syntax error");

  std::shared_ptr<tchecker::typed_expression_t> guard_typed_expr{
      tchecker::typecheck(*guard_expr, localvars, integer_variables(), clock_variables())};
  assert(tchecker::bool_valued(guard_typed_expr->type()));

  try {
    std::shared_ptr<tchecker::bytecode_t> guard_bytecode{tchecker::compile(*guard_typed_expr),
                                                         std::default_delete<tchecker::bytecode_t[]>()};
    _guards[id] = {guard_typed_expr, guard_bytecode};
  }
  catch (std::exception const & e) {
    std::stringstream oss;
    oss << e.what();
    throw std::invalid_argument(oss.str());
  }
}